

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O2

QRectF * __thiscall
QWidgetWindowPrivate::closestAcceptableGeometry
          (QRectF *__return_storage_ptr__,QWidgetWindowPrivate *this,QRectF *rect)

{
  double dVar1;
  long lVar2;
  QWidget *widget;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  qreal qVar6;
  qreal qVar7;
  char cVar8;
  QSize QVar9;
  int iVar10;
  int iVar11;
  long in_FS_OFFSET;
  ulong uVar12;
  ulong uVar13;
  qreal qVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  QRectF local_68;
  QSize local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(*(long *)&this->field_0x8 + 0x28);
  if ((((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) &&
      (widget = *(QWidget **)(*(long *)&this->field_0x8 + 0x30), widget != (QWidget *)0x0)) &&
     (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) {
    cVar8 = (**(code **)(*(long *)widget + 0x88))(widget);
    if (cVar8 != '\0') {
      local_68.xp = rect->w;
      local_68.yp = rect->h;
      local_40 = QSizeF::toSize((QSizeF *)&local_68);
      QVar9 = QLayout::closestAcceptableSize(widget,&local_40);
      if (QVar9.ht.m_i.m_i == local_40.ht.m_i && QVar9.wd.m_i.m_i == local_40.wd.m_i) {
        __return_storage_ptr__->w = 0.0;
        __return_storage_ptr__->h = 0.0;
        __return_storage_ptr__->xp = 0.0;
        __return_storage_ptr__->yp = 0.0;
      }
      else {
        iVar11 = QVar9.wd.m_i.m_i - local_40.wd.m_i;
        iVar10 = QVar9.ht.m_i.m_i - local_40.ht.m_i;
        qVar14 = rect->xp;
        qVar6 = rect->yp;
        qVar7 = rect->h;
        __return_storage_ptr__->w = rect->w;
        __return_storage_ptr__->h = qVar7;
        __return_storage_ptr__->xp = qVar14;
        __return_storage_ptr__->yp = qVar6;
        local_68.w._0_4_ = 0xffffffff;
        local_68.w._4_4_ = 0xffffffff;
        local_68.h._0_4_ = 0xffffffff;
        local_68.h._4_4_ = 0xffffffff;
        local_68.xp = -NAN;
        local_68.yp = -NAN;
        QRectF::QRectF(&local_68,&widget->data->crect);
        dVar1 = __return_storage_ptr__->yp;
        dVar15 = dVar1 + __return_storage_ptr__->h;
        dVar18 = dVar1 - local_68.yp;
        dVar19 = dVar15 - ((double)CONCAT44(local_68.h._4_4_,local_68.h._0_4_) + local_68.yp);
        uVar12 = -(ulong)(dVar18 < -dVar18);
        uVar13 = -(ulong)(dVar19 < -dVar19);
        uVar5 = (ulong)-dVar19 & uVar13;
        auVar16._0_8_ = ~uVar12 & (ulong)dVar18;
        auVar16._8_8_ = ~uVar13 & (ulong)dVar19;
        auVar3._8_4_ = (int)uVar5;
        auVar3._0_8_ = (ulong)-dVar18 & uVar12;
        auVar3._12_4_ = (int)(uVar5 >> 0x20);
        dVar18 = (double)iVar10;
        if (SUB168(auVar16 | auVar3,0) <= SUB168(auVar16 | auVar3,8)) {
          qVar14 = (dVar15 + dVar18) - dVar1;
        }
        else {
          dVar18 = (dVar1 - dVar18) - dVar1;
          __return_storage_ptr__->yp = dVar1 + dVar18;
          qVar14 = __return_storage_ptr__->h - dVar18;
        }
        __return_storage_ptr__->h = qVar14;
        dVar1 = __return_storage_ptr__->xp;
        dVar15 = dVar1 + __return_storage_ptr__->w;
        dVar18 = dVar1 - local_68.xp;
        dVar19 = dVar15 - ((double)CONCAT44(local_68.w._4_4_,local_68.w._0_4_) + local_68.xp);
        uVar12 = -(ulong)(dVar18 < -dVar18);
        uVar13 = -(ulong)(dVar19 < -dVar19);
        uVar5 = (ulong)-dVar19 & uVar13;
        auVar17._0_8_ = ~uVar12 & (ulong)dVar18;
        auVar17._8_8_ = ~uVar13 & (ulong)dVar19;
        auVar4._8_4_ = (int)uVar5;
        auVar4._0_8_ = (ulong)-dVar18 & uVar12;
        auVar4._12_4_ = (int)(uVar5 >> 0x20);
        dVar18 = (double)iVar11;
        if (SUB168(auVar17 | auVar4,0) <= SUB168(auVar17 | auVar4,8)) {
          qVar14 = (dVar15 + dVar18) - dVar1;
        }
        else {
          dVar18 = (dVar1 - dVar18) - dVar1;
          __return_storage_ptr__->xp = dVar1 + dVar18;
          qVar14 = __return_storage_ptr__->w - dVar18;
        }
        __return_storage_ptr__->w = qVar14;
      }
      goto LAB_00312aca;
    }
  }
  local_68.xp = 0.0;
  local_68.yp = -NAN;
  QRectF::QRectF(__return_storage_ptr__,(QRect *)&local_68);
LAB_00312aca:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QWidgetWindowPrivate::closestAcceptableGeometry(const QRectF &rect) const
{
    Q_Q(const QWidgetWindow);
    const QWidget *widget = q->widget();
    if (!widget || !widget->isWindow() || !widget->hasHeightForWidth())
        return QRect();
    const QSize oldSize = rect.size().toSize();
    const QSize newSize = QLayout::closestAcceptableSize(widget, oldSize);
    if (newSize == oldSize)
        return QRectF();
    const int dw = newSize.width() - oldSize.width();
    const int dh = newSize.height() - oldSize.height();
    QRectF result = rect;
    const QRectF currentGeometry(widget->geometry());
    const qreal topOffset = result.top() - currentGeometry.top();
    const qreal bottomOffset = result.bottom() - currentGeometry.bottom();
    if (qAbs(topOffset) > qAbs(bottomOffset))
        result.setTop(result.top() - dh); // top edge drag
    else
        result.setBottom(result.bottom() + dh); // bottom edge drag
    const qreal leftOffset = result.left() - currentGeometry.left();
    const qreal rightOffset = result.right() - currentGeometry.right();
    if (qAbs(leftOffset) > qAbs(rightOffset))
        result.setLeft(result.left() - dw); // left edge drag
    else
        result.setRight(result.right() + dw); // right edge drag
    return result;
}